

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void normalize_image_u8_to_f32(clip_image_u8 *src,clip_image_f32 *dst,float *mean,float *std)

{
  pointer puVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  iVar4 = src->ny;
  dst->nx = src->nx;
  dst->ny = iVar4;
  ::std::vector<float,_std::allocator<float>_>::resize
            (&dst->buf,
             (long)(src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar7 != 0) {
    pfVar2 = (dst->buf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar5;
      uVar6 = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
      pfVar2[uVar5] =
           ((float)puVar1[uVar5] / 255.0 - *(float *)((long)mean + uVar5 * 4 + uVar6 * -3)) /
           *(float *)((long)std + uVar5 * 4 + uVar6 * -3);
      uVar5 = uVar5 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar5);
  }
  return;
}

Assistant:

static void normalize_image_u8_to_f32(const clip_image_u8 & src, clip_image_f32 & dst, const float mean[3], const float std[3]) {
    dst.nx = src.nx;
    dst.ny = src.ny;
    dst.buf.resize(src.buf.size());

    // TODO @ngxson : seems like this could be done more efficiently on cgraph
    for (size_t i = 0; i < src.buf.size(); ++i) {
        int c = i % 3; // rgb
        dst.buf[i] = (static_cast<float>(src.buf[i]) / 255.0f - mean[c]) / std[c];
    }
}